

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

nk_uint * nk_add_value(nk_context *ctx,nk_window *win,nk_hash name,nk_uint value)

{
  uint uVar1;
  nk_table *pnVar2;
  nk_page_element *ptr;
  nk_uint *pnVar3;
  ulong uVar4;
  
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anael-seghezzi[P]glfw/deps/nuklear.h"
                  ,0x3c22,
                  "nk_uint *nk_add_value(struct nk_context *, struct nk_window *, nk_hash, nk_uint)"
                 );
  }
  if (win != (nk_window *)0x0) {
    ptr = (nk_page_element *)win->tables;
    if ((ptr == (nk_page_element *)0x0) ||
       (uVar1 = (ptr->data).tbl.size, uVar4 = (ulong)uVar1, 0x3a < uVar1)) {
      ptr = nk_create_page_element(ctx);
      nk_zero(ptr,0x200);
      pnVar2 = win->tables;
      if (pnVar2 == (nk_table *)0x0) {
        win->tables = (nk_table *)ptr;
        (ptr->data).tbl.size = 0;
        (ptr->data).tbl.next = (nk_table *)0x0;
        (ptr->data).tbl.prev = (nk_table *)0x0;
        win->table_count = 1;
        ptr = (nk_page_element *)win->tables;
        uVar4 = (ulong)(ptr->data).tbl.size;
      }
      else {
        pnVar2->prev = (nk_table *)ptr;
        (ptr->data).tbl.next = pnVar2;
        (ptr->data).tbl.prev = (nk_table *)0x0;
        (ptr->data).tbl.size = 0;
        win->tables = (nk_table *)ptr;
        win->table_count = win->table_count + 1;
        uVar4 = 0;
      }
    }
    (ptr->data).tbl.seq = win->seq;
    pnVar3 = (nk_uint *)((long)&ptr->data + uVar4 * 4 + 0xf4);
    *(nk_hash *)((long)&ptr->data + uVar4 * 4 + 8) = name;
    *pnVar3 = 0;
    (ptr->data).tbl.size = (int)uVar4 + 1;
    return pnVar3;
  }
  __assert_fail("win",
                "/workspace/llm4binary/github/license_all_cmakelists_25/anael-seghezzi[P]glfw/deps/nuklear.h"
                ,0x3c23,
                "nk_uint *nk_add_value(struct nk_context *, struct nk_window *, nk_hash, nk_uint)");
}

Assistant:

NK_LIB nk_uint*
nk_add_value(struct nk_context *ctx, struct nk_window *win,
            nk_hash name, nk_uint value)
{
    NK_ASSERT(ctx);
    NK_ASSERT(win);
    if (!win || !ctx) return 0;
    if (!win->tables || win->tables->size >= NK_VALUE_PAGE_CAPACITY) {
        struct nk_table *tbl = nk_create_table(ctx);
        NK_ASSERT(tbl);
        if (!tbl) return 0;
        nk_push_table(win, tbl);
    }
    win->tables->seq = win->seq;
    win->tables->keys[win->tables->size] = name;
    win->tables->values[win->tables->size] = value;
    return &win->tables->values[win->tables->size++];
}